

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::CmdLine::ui_separator(string *title,string *short_title)

{
  bool bVar1;
  index_t iVar2;
  Logger *this;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  void *this_00;
  long lVar6;
  size_t nb;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [8];
  string s_1;
  size_t L;
  string s;
  string local_68 [48];
  string local_38 [8];
  string shortt;
  string *short_title_local;
  string *title_local;
  
  this = Logger::instance();
  bVar1 = Logger::is_quiet(this);
  if (!bVar1) {
    if ((::(anonymous_namespace)::man_mode & 1) == 0) {
      bVar1 = anon_unknown.dwarf_5292d::is_redirected();
      if (bVar1) {
        poVar3 = anon_unknown.dwarf_5292d::ui_out();
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        bVar1 = std::operator!=(short_title,"");
        if ((bVar1) && (bVar1 = std::operator!=(title,""), bVar1)) {
          poVar3 = anon_unknown.dwarf_5292d::ui_out();
          poVar3 = std::operator<<(poVar3,"=[");
          poVar3 = std::operator<<(poVar3,(string *)short_title);
          poVar3 = std::operator<<(poVar3,"]=[");
          poVar3 = std::operator<<(poVar3,(string *)title);
          poVar3 = std::operator<<(poVar3,"]=");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&L,
                         title);
          poVar3 = anon_unknown.dwarf_5292d::ui_out();
          poVar3 = std::operator<<(poVar3,"=[");
          poVar3 = std::operator<<(poVar3,(string *)&L);
          poVar3 = std::operator<<(poVar3,"]=");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&L);
        }
      }
      else {
        anon_unknown.dwarf_5292d::update_ui_term_width();
        ::(anonymous_namespace)::ui_separator_opened = 1;
        lVar4 = std::__cxx11::string::length();
        lVar6 = std::__cxx11::string::length();
        poVar3 = anon_unknown.dwarf_5292d::ui_out();
        std::operator<<(poVar3,"   ");
        anon_unknown.dwarf_5292d::ui_pad(' ',(ulong)::(anonymous_namespace)::ui_left_margin);
        anon_unknown.dwarf_5292d::ui_pad('_',lVar4 + lVar6 + 0xe);
        poVar3 = anon_unknown.dwarf_5292d::ui_out();
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        anon_unknown.dwarf_5292d::ui_pad(' ',(ulong)::(anonymous_namespace)::ui_left_margin);
        bVar1 = std::operator!=(short_title,"");
        if ((bVar1) && (bVar1 = std::operator!=(title,""), bVar1)) {
          poVar3 = anon_unknown.dwarf_5292d::ui_out();
          poVar3 = std::operator<<(poVar3," _/ ==[");
          poVar3 = std::operator<<(poVar3,(string *)short_title);
          poVar3 = std::operator<<(poVar3,"]====[");
          poVar3 = std::operator<<(poVar3,(string *)title);
          std::operator<<(poVar3,"]== \\");
        }
        else {
          std::operator+(local_b0,title);
          poVar3 = anon_unknown.dwarf_5292d::ui_out();
          poVar3 = std::operator<<(poVar3," _/ =====[");
          poVar3 = std::operator<<(poVar3,(string *)local_b0);
          std::operator<<(poVar3,"]===== \\");
          std::__cxx11::string::~string((string *)local_b0);
        }
        iVar2 = ui_terminal_width();
        nb = anon_unknown.dwarf_5292d::sub
                       ((ulong)iVar2,
                        (ulong)::(anonymous_namespace)::ui_right_margin + 0x13 +
                        lVar4 + lVar6 + (ulong)::(anonymous_namespace)::ui_left_margin);
        anon_unknown.dwarf_5292d::ui_pad('_',nb);
        poVar3 = anon_unknown.dwarf_5292d::ui_out();
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"\n",&local_d1);
        ui_message((string *)local_d0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
    }
    else {
      bVar1 = std::operator==(title,"");
      if (!bVar1) {
        poVar3 = anon_unknown.dwarf_5292d::ui_out();
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_38,(string *)short_title);
        lVar4 = std::__cxx11::string::length();
        if ((lVar4 == 0) ||
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar5 != '*')) {
          poVar3 = anon_unknown.dwarf_5292d::ui_out();
          poVar3 = std::operator<<(poVar3,(string *)title);
          poVar3 = std::operator<<(poVar3," (\"");
          poVar3 = std::operator<<(poVar3,local_38);
          poVar3 = std::operator<<(poVar3,":*\" options)");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_68,(ulong)local_38);
          std::__cxx11::string::operator=(local_38,local_68);
          std::__cxx11::string::~string(local_68);
          poVar3 = anon_unknown.dwarf_5292d::ui_out();
          poVar3 = std::operator<<(poVar3,(string *)title);
          poVar3 = std::operator<<(poVar3," (\"");
          poVar3 = std::operator<<(poVar3,local_38);
          poVar3 = std::operator<<(poVar3,":*\" options, advanced)");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        poVar3 = anon_unknown.dwarf_5292d::ui_out();
        this_00 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_38);
      }
    }
  }
  return;
}

Assistant:

void ui_separator(
            const std::string& title,
            const std::string& short_title
        ) {
            if(Logger::instance()->is_quiet()) {
                return;
            }

            if(man_mode) {
                if(title == "") {
                    return;
                }
                ui_out() << std::endl;
                std::string shortt = short_title;
                if(shortt.length() > 0 && shortt[0] == '*') {
                    shortt = shortt.substr(1, shortt.length()-1);
                    ui_out() << title << " (\"" << shortt << ":*\" options, advanced)"
                             << std::endl;
                } else {
                    ui_out() << title << " (\"" << shortt << ":*\" options)"
                             << std::endl;
                }
                ui_out() << std::endl << std::endl;                
                return;
            }
            
            if(is_redirected()) {
                ui_out() << std::endl;
                if(short_title != "" && title != "") {
                    ui_out() << "=[" << short_title << "]=["
                        << title << "]=" << std::endl;
                } else {
                    std::string s = title + short_title;
                    ui_out() << "=[" << s << "]=" << std::endl;
                }
                return;
            }

            update_ui_term_width();
            ui_separator_opened = true;

            size_t L = title.length() + short_title.length();

            ui_out() << "   ";
            ui_pad(' ', ui_left_margin);
            ui_pad('_', L + 14);
            ui_out() << std::endl;

            ui_pad(' ', ui_left_margin);
            if(short_title != "" && title != "") {
                ui_out() << " _/ ==[" << short_title << "]====["
                    << title << "]== \\";
            } else {
                std::string s = title + short_title;
                ui_out() << " _/ =====[" << s << "]===== \\";
            }

            ui_pad(
                '_',
                sub(
                    ui_terminal_width(),
                    19 + L + ui_left_margin + ui_right_margin
                )
            );
            ui_out() << std::endl;

            // Force a blank line under the separator
            ui_message("\n");
        }